

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.cpp
# Opt level: O0

PureFunctionCall * __thiscall
soul::BlockBuilder::createMinInt32(BlockBuilder *this,Expression *a,Expression *b)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *this_00;
  Module *m;
  Function *args_1;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *this_01;
  bool local_b9;
  pool_ref<soul::heart::Expression> local_b8;
  PureFunctionCall *local_b0;
  PureFunctionCall *call;
  function<void_(soul::FunctionBuilder_&)> local_a0;
  Type local_80;
  allocator<char> local_51;
  string local_50;
  Function *local_30;
  Function *function;
  Module *internalModule;
  Expression *b_local;
  Expression *a_local;
  BlockBuilder *this_local;
  
  internalModule = (Module *)b;
  b_local = a;
  a_local = (Expression *)this;
  iVar2 = (*(a->super_Object)._vptr_Object[2])();
  bVar1 = Type::isInteger32((Type *)CONCAT44(extraout_var,iVar2));
  local_b9 = false;
  if (bVar1) {
    this_00 = (Type *)(*(code *)(((internalModule->program).pimpl)->allocator).pool.pools.
                                super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)();
    local_b9 = Type::isInteger32(this_00);
  }
  checkAssertion(local_b9,"a.getType().isInteger32() && b.getType().isInteger32()","createMinInt32",
                 0x2a);
  m = anon_unknown.dwarf_79657::getInternalModule(&this->module->program);
  function = (Function *)m;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"_minInt32",&local_51);
  Type::Type(&local_80,int32);
  std::function<void(soul::FunctionBuilder&)>::
  function<soul::BlockBuilder::createMinInt32(soul::heart::Expression&,soul::heart::Expression&)::__0,void>
            ((function<void(soul::FunctionBuilder&)> *)&local_a0,
             (anon_class_1_0_00000001 *)((long)&call + 7));
  args_1 = FunctionBuilder::getOrCreateFunction(m,&local_50,&local_80,&local_a0);
  std::function<void_(soul::FunctionBuilder_&)>::~function(&local_a0);
  Type::~Type(&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_30 = args_1;
  local_b0 = Module::
             allocate<soul::heart::PureFunctionCall,soul::CodeLocation&,soul::heart::Function&>
                       (this->module,&(b_local->super_Object).location,args_1);
  this_01 = &local_b0->arguments;
  pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_b8,b_local);
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>::
  push_back<soul::heart::Expression&>
            ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul> *)this_01,
             &local_b8,(Expression *)internalModule);
  pool_ref<soul::heart::Expression>::~pool_ref(&local_b8);
  return local_b0;
}

Assistant:

heart::PureFunctionCall& BlockBuilder::createMinInt32 (heart::Expression& a, heart::Expression& b)
{
    SOUL_ASSERT (a.getType().isInteger32() && b.getType().isInteger32());

    auto& internalModule = getInternalModule (module.program);

    auto& function = soul::FunctionBuilder::getOrCreateFunction (internalModule, minInt32Fn, PrimitiveType::int32, [] (FunctionBuilder& builder)
    {
        auto& paramA = builder.addParameter ("a", PrimitiveType::int32);
        auto& paramB = builder.addParameter ("b", PrimitiveType::int32);

        auto& lessThan = builder.createBlock ("@lessThan");
        auto& moreThan = builder.createBlock ("@moreThan");

        builder.addBranchIf (builder.createComparisonOp (paramA, paramB, BinaryOp::Op::lessThan), lessThan, moreThan, lessThan);
        builder.addReturn (paramA);
        builder.beginBlock (moreThan);
        builder.addReturn (paramB);
    });

    auto& call = module.allocate<heart::PureFunctionCall> (a.location, function);
    call.arguments.push_back (a, b);
    return call;
}